

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintAttrValue(TidyDocImpl *doc,uint indent,ctmbstr value,uint delim,Bool wrappable,
                    Bool scriptAttr)

{
  int iVar1;
  uint uVar2;
  char *str;
  uint local_64;
  ctmbstr entity;
  uint c;
  int strStart;
  int attrStart;
  uint wraplen;
  uint mode;
  Bool scriptlets;
  TidyPrintImpl *pprint;
  Bool local_28;
  Bool scriptAttr_local;
  Bool wrappable_local;
  uint delim_local;
  ctmbstr value_local;
  TidyDocImpl *pTStack_10;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  _mode = &doc->pprint;
  wraplen = (uint)(doc->config).value[0x5f].v;
  attrStart = 5;
  if (wrappable != no) {
    attrStart = 4;
  }
  pprint._4_4_ = scriptAttr;
  local_28 = wrappable;
  scriptAttr_local = delim;
  _wrappable_local = value;
  value_local._4_4_ = indent;
  pTStack_10 = doc;
  if (((value != (ctmbstr)0x0) && (*value == '<')) &&
     ((value[1] == '%' ||
      ((value[1] == '@' || (iVar1 = prvTidytmbstrncmp(value,"<?php",5), iVar1 == 0)))))) {
    attrStart = attrStart | 0x10;
  }
  if (scriptAttr_local == no) {
    scriptAttr_local = 0x22;
  }
  AddChar(_mode,0x3d);
  if (((int)(pTStack_10->config).value[100].v == 0) ||
     ((int)(pTStack_10->config).value[0x62].v != 0)) {
    SetWrap(pTStack_10,value_local._4_4_);
    CheckWrapIndent(pTStack_10,value_local._4_4_);
  }
  AddChar(_mode,scriptAttr_local);
  if (_wrappable_local != (char *)0x0) {
    strStart = (int)(pTStack_10->config).value[0x5d].v;
    c = SetInAttrVal(_mode);
    entity._4_4_ = ClearInString(_mode);
    while (*_wrappable_local != '\0') {
      entity._0_4_ = (Bool)*_wrappable_local;
      if ((local_28 != no) && ((Bool)entity == 0x20)) {
        SetWrapAttr(pTStack_10,value_local._4_4_,c,entity._4_4_);
      }
      if (((local_28 != no) && (_mode->wraphere != 0)) &&
         (uVar2 = GetSpaces(_mode), (uint)strStart <= uVar2 + _mode->linelen)) {
        WrapAttrVal(pTStack_10);
      }
      if ((Bool)entity == scriptAttr_local) {
        str = "&#39;";
        if ((Bool)entity == 0x22) {
          str = "&quot;";
        }
        AddString(_mode,str);
        _wrappable_local = _wrappable_local + 1;
      }
      else if ((Bool)entity == 0x22) {
        if ((int)(pTStack_10->config).value[0x46].v == 0) {
          AddChar(_mode,0x22);
        }
        else {
          AddString(_mode,"&quot;");
        }
        if (((scriptAttr_local == 0x27) && (pprint._4_4_ != no)) && (wraplen != 0)) {
          entity._4_4_ = ToggleInString(_mode);
        }
        _wrappable_local = _wrappable_local + 1;
      }
      else if ((Bool)entity == 0x27) {
        if ((int)(pTStack_10->config).value[0x46].v == 0) {
          AddChar(_mode,0x27);
        }
        else {
          AddString(_mode,"&#39;");
        }
        if (((scriptAttr_local == 0x22) && (pprint._4_4_ != no)) && (wraplen != 0)) {
          entity._4_4_ = ToggleInString(_mode);
        }
        _wrappable_local = _wrappable_local + 1;
      }
      else {
        if (0x7f < (Bool)entity) {
          uVar2 = prvTidyGetUTF8(_wrappable_local,(uint *)&entity);
          _wrappable_local = _wrappable_local + uVar2;
        }
        _wrappable_local = _wrappable_local + 1;
        if ((Bool)entity == 10) {
          if ((entity._4_4_ < 0) && ((int)(pTStack_10->config).value[0x2c].v == 0)) {
            local_64 = value_local._4_4_;
          }
          else {
            local_64 = 0;
          }
          prvTidyPFlushLine(pTStack_10,local_64);
        }
        else {
          PPrintChar(pTStack_10,(Bool)entity,attrStart);
        }
      }
    }
    ClearInAttrVal(_mode);
    ClearInString(_mode);
  }
  AddChar(_mode,scriptAttr_local);
  return;
}

Assistant:

static void PPrintAttrValue( TidyDocImpl* doc, uint indent,
                             ctmbstr value, uint delim, Bool wrappable, Bool scriptAttr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool scriptlets = cfgBool(doc, TidyWrapScriptlets);

    uint mode = PREFORMATTED | ATTRIBVALUE;
    if ( wrappable )
        mode = NORMAL | ATTRIBVALUE;

    /* look for ASP, Tango or PHP instructions for computed attribute value */
    if ( value && value[0] == '<' )
    {
        if ( value[1] == '%' || value[1] == '@'||
             TY_(tmbstrncmp)(value, "<?php", 5) == 0 )
            mode |= CDATA;
    }

    if ( delim == 0 )
        delim = '"';

    AddChar( pprint, '=' );

    /* don't wrap after "=" for xml documents */
    if ( !cfgBool(doc, TidyXmlOut) || cfgBool(doc, TidyXhtmlOut) )
    {
        SetWrap( doc, indent );
        CheckWrapIndent( doc, indent );
        /*
        if ( !SetWrap(doc, indent) )
            PCondFlushLine( doc, indent );
        */
    }

    AddChar( pprint, delim );

    if ( value )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        int attrStart = SetInAttrVal( pprint );
        int strStart = ClearInString( pprint );

        while (*value != '\0')
        {
            uint c = *value;

            if ( wrappable && c == ' ' )
                SetWrapAttr( doc, indent, attrStart, strStart );

            if ( wrappable && pprint->wraphere > 0 &&
                 GetSpaces(pprint) + pprint->linelen >= wraplen )
                WrapAttrVal( doc );

            if ( c == delim )
            {
                ctmbstr entity = (c == '"' ? "&quot;" : "&#39;");
                AddString( pprint, entity );
                ++value;
                continue;
            }
            else if (c == '"')
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&quot;" );
                else
                    AddChar( pprint, c );

                if ( delim == '\'' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }
            else if ( c == '\'' )
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&#39;" );
                else
                    AddChar( pprint, c );

                if ( delim == '"' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }

            /* look for UTF-8 multibyte character */
            if ( c > 0x7F )
                 value += TY_(GetUTF8)( value, &c );
            ++value;

            if ( c == '\n' )
            {
                /* No indent inside Javascript literals */
                TY_(PFlushLine)( doc, (strStart < 0
                                       && !cfgBool(doc, TidyLiteralAttribs) ?
                                       indent : 0) );
                continue;
            }
            PPrintChar( doc, c, mode );
        }
        ClearInAttrVal( pprint );
        ClearInString( pprint );
    }
    AddChar( pprint, delim );
}